

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.cxx
# Opt level: O1

bool cmUseMangledMesaCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *directory;
  pointer pbVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  size_type *psVar5;
  undefined1 uVar6;
  pointer pbVar8;
  undefined8 unaff_RBP;
  char *pcVar9;
  _Alloc_hider _Var10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string gfile;
  string inLine;
  string includeFile;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string dir;
  string path;
  string tempOutputFile;
  string outFile;
  string glh;
  string e;
  ifstream fin;
  ofstream fout;
  RegularExpression glDirLine;
  RegularExpression glLine;
  char *local_810;
  long local_808;
  char local_800;
  undefined7 uStack_7ff;
  string local_7f0;
  undefined4 local_7cc;
  char *local_7c8;
  undefined8 local_7c0;
  char local_7b8;
  undefined7 uStack_7b7;
  string local_7a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  undefined8 local_6e8;
  _func_int **local_6e0;
  pointer local_6d8;
  string *local_6d0;
  string local_6c8;
  undefined1 local_6a8 [88];
  char *local_650;
  char *local_5f8;
  char *local_5e8;
  int local_5e0;
  undefined1 local_5d8 [32];
  size_type local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5b0;
  undefined1 local_3d0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  byte abStack_3b0 [216];
  ios_base local_2d8 [264];
  RegularExpression local_1d0;
  RegularExpression local_100;
  undefined4 uVar7;
  
  directory = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)directory == 0x40) {
    local_5d8._8_8_ = (directory->_M_dataplus)._M_p;
    local_5d8._0_8_ = directory->_M_string_length;
    local_5d8._16_8_ = 5;
    local_5d8._24_8_ = "/gl.h";
    views._M_len = 2;
    views._M_array = (iterator)local_5d8;
    cmCatViews_abi_cxx11_(&local_6c8,views);
    bVar2 = cmsys::SystemTools::FileExists(&local_6c8);
    if (bVar2) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_788.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_788.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_788.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5d8._0_8_ = local_5d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"\\.h$","");
      cmSystemTools::Glob(directory,(string *)local_5d8,&local_788);
      if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
        operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
      }
      local_7cc = (undefined4)
                  CONCAT71((int7)((ulong)unaff_RBP >> 8),
                           local_788.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start !=
                           local_788.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      if (local_788.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_788.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d8,"Could not open Mesa Directory ",directory);
        cmSystemTools::Error((string *)local_5d8);
        if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
          operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
        }
      }
      else {
        local_6d0 = directory;
        cmsys::SystemTools::MakeDirectory(pbVar1 + 1,(mode_t *)0x0);
        local_6d8 = local_788.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_788.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_788.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_6e0 = _VTT;
          local_6e8 = _EVP_PKEY_get_bn_param;
          pbVar8 = local_788.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_5d8._8_8_ = (local_6d0->_M_dataplus)._M_p;
            local_5d8._0_8_ = local_6d0->_M_string_length;
            local_3d0 = (undefined1  [8])&DAT_00000001;
            local_5d8._24_8_ = &local_3c0;
            local_3c0._M_local_buf[0] = '/';
            local_5d8._16_8_ = 1;
            local_5b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar8->_M_dataplus)._M_p;
            local_5b8 = pbVar8->_M_string_length;
            views_00._M_len = 3;
            views_00._M_array = (iterator)local_5d8;
            local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5d8._24_8_;
            cmCatViews_abi_cxx11_(&local_748,views_00);
            local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
            local_768._M_string_length = 0;
            local_768.field_2._M_local_buf[0] = '\0';
            local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
            local_7a8._M_string_length = 0;
            local_7a8.field_2._M_local_buf[0] = '\0';
            cmsys::SystemTools::SplitProgramPath(&local_748,&local_768,&local_7a8,true);
            local_5d8._8_8_ = pbVar1[1]._M_dataplus._M_p;
            local_5d8._0_8_ = pbVar1[1]._M_string_length;
            local_3d0 = (undefined1  [8])&DAT_00000001;
            local_5d8._24_8_ = &local_3c0;
            local_3c0._M_local_buf[0] = '/';
            local_5d8._16_8_ = 1;
            local_5b8 = local_7a8._M_string_length;
            local_5b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7a8._M_dataplus._M_p;
            views_01._M_len = 3;
            views_01._M_array = (iterator)local_5d8;
            local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5d8._24_8_;
            cmCatViews_abi_cxx11_(&local_708,views_01);
            local_5d8._0_8_ = local_708._M_string_length;
            local_5d8._8_8_ = local_708._M_dataplus._M_p;
            local_5d8._16_8_ = 4;
            local_5d8._24_8_ = (long)"%s.%s.tmp" + 5;
            views_02._M_len = 2;
            views_02._M_array = (iterator)local_5d8;
            cmCatViews_abi_cxx11_(&local_728,views_02);
            std::ofstream::ofstream(local_3d0,local_728._M_dataplus._M_p,_S_out);
            if ((abStack_3b0[(long)*(_func_int **)((long)local_3d0 + -0x18)] & 5) == 0) {
              std::ifstream::ifstream((string *)local_5d8,local_748._M_dataplus._M_p,_S_in);
              if ((*(byte *)((long)&local_5b8 + *(size_type *)(local_5d8._0_8_ + -0x18)) & 5) == 0)
              {
                local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
                local_7f0._M_string_length = 0;
                local_7f0.field_2._M_local_buf[0] = '\0';
                local_5f8 = (char *)0x0;
                local_5e8 = (char *)0x0;
                local_5e0 = 0;
                memset((RegularExpression *)local_6a8,0,0xaa);
                cmsys::RegularExpression::compile
                          ((RegularExpression *)local_6a8,
                           "^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
                local_1d0.regmust = (char *)0x0;
                local_1d0.program = (char *)0x0;
                local_1d0.progsize = 0;
                memset(&local_1d0,0,0xaa);
                cmsys::RegularExpression::compile(&local_1d0,"(gl|GL)(/|\\\\)([^<\"]+)");
                local_100.regmust = (char *)0x0;
                local_100.program = (char *)0x0;
                local_100.progsize = 0;
                memset(&local_100,0,0xaa);
                cmsys::RegularExpression::compile(&local_100,"(gl|GL|xmesa)");
                while (bVar2 = cmsys::SystemTools::GetLineFromStream
                                         ((istream *)local_5d8,&local_7f0,(bool *)0x0,
                                          0xffffffffffffffff), bVar2) {
                  bVar2 = cmsys::RegularExpression::find
                                    ((RegularExpression *)local_6a8,local_7f0._M_dataplus._M_p,
                                     (RegularExpressionMatch *)local_6a8);
                  if (bVar2) {
                    if ((char *)local_6a8._8_8_ == (char *)0x0) {
                      local_7c8 = &local_7b8;
                      local_7c0 = 0;
                      local_7b8 = '\0';
                    }
                    else {
                      local_7c8 = &local_7b8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_7c8,local_6a8._8_8_,local_650);
                    }
                    bVar2 = cmsys::RegularExpression::find(&local_1d0,local_7c8,&local_1d0.regmatch)
                    ;
                    if (bVar2) {
                      if (local_1d0.regmatch.startp[3] == (char *)0x0) {
                        local_810 = &local_800;
                        local_808 = 0;
                        local_800 = '\0';
                      }
                      else {
                        local_810 = &local_800;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_810,local_1d0.regmatch.startp[3],
                                   local_1d0.regmatch.endp[3]);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,"#include \"",10);
                      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_3d0,pbVar1[1]._M_dataplus._M_p,
                                          pbVar1[1]._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
                      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar4,local_810,local_808);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
LAB_002ea15b:
                      if (local_810 != &local_800) {
                        operator_delete(local_810,CONCAT71(uStack_7ff,local_800) + 1);
                      }
                    }
                    else {
                      bVar2 = cmsys::RegularExpression::find
                                        (&local_100,local_7c8,&local_100.regmatch);
                      if (bVar2) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3d0,"#include \"",10);
                        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)local_3d0,pbVar1[1]._M_dataplus._M_p,
                                            pbVar1[1]._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
                        if ((char *)local_6a8._8_8_ == (char *)0x0) {
                          local_810 = &local_800;
                          local_808 = 0;
                          local_800 = '\0';
                        }
                        else {
                          local_810 = &local_800;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_810,local_6a8._8_8_,local_650);
                        }
                        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                           (poVar4,local_810,local_808);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
                        goto LAB_002ea15b;
                      }
                      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_3d0,local_7f0._M_dataplus._M_p,
                                          local_7f0._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
                    }
                    if (local_7c8 != &local_7b8) {
                      operator_delete(local_7c8,CONCAT71(uStack_7b7,local_7b8) + 1);
                    }
                  }
                  else {
                    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_3d0,local_7f0._M_dataplus._M_p,
                                        local_7f0._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
                  }
                }
                std::ifstream::close();
                std::ofstream::close();
                cmSystemTools::MoveFileIfDifferent(&local_728,&local_708);
                if (local_100.program != (char *)0x0) {
                  operator_delete__(local_100.program);
                }
                if (local_1d0.program != (char *)0x0) {
                  operator_delete__(local_1d0.program);
                }
                if (local_5e8 != (char *)0x0) {
                  operator_delete__(local_5e8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
                  pcVar9 = (char *)CONCAT71(local_7f0.field_2._M_allocated_capacity._1_7_,
                                            local_7f0.field_2._M_local_buf[0]);
                  _Var10._M_p = local_7f0._M_dataplus._M_p;
                  goto LAB_002ea210;
                }
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6a8,"Could not open file for read in copy operation",&local_748
                              );
                cmSystemTools::Error((string *)local_6a8);
                pcVar9 = (char *)local_6a8._16_8_;
                _Var10._M_p = (pointer)local_6a8._0_8_;
                if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
LAB_002ea210:
                  operator_delete(_Var10._M_p,(ulong)(pcVar9 + 1));
                }
              }
              std::ifstream::~ifstream((string *)local_5d8);
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6a8,"Could not open file for write in copy operation: ",
                             &local_728);
              plVar3 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_6a8,(ulong)pbVar1[1]._M_dataplus._M_p);
              local_5d8._0_8_ = local_5d8 + 0x10;
              psVar5 = (size_type *)(plVar3 + 2);
              if ((size_type *)*plVar3 == psVar5) {
                local_5d8._16_8_ = *psVar5;
                local_5d8._24_8_ = plVar3[3];
              }
              else {
                local_5d8._16_8_ = *psVar5;
                local_5d8._0_8_ = (size_type *)*plVar3;
              }
              local_5d8._8_8_ = plVar3[1];
              *plVar3 = (long)psVar5;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              cmSystemTools::Error((string *)local_5d8);
              if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
                operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
              }
              if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
                operator_delete((void *)local_6a8._0_8_,(ulong)(local_6a8._16_8_ + 1));
              }
              cmSystemTools::ReportLastSystemError("");
            }
            local_3d0 = (undefined1  [8])local_6e0;
            *(undefined8 *)(local_3d0 + (long)local_6e0[-3]) = local_6e8;
            std::filebuf::~filebuf((filebuf *)&local_3c8);
            std::ios_base::~ios_base(local_2d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_728._M_dataplus._M_p != &local_728.field_2) {
              operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_708._M_dataplus._M_p != &local_708.field_2) {
              operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
              operator_delete(local_7a8._M_dataplus._M_p,
                              CONCAT71(local_7a8.field_2._M_allocated_capacity._1_7_,
                                       local_7a8.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_768._M_dataplus._M_p != &local_768.field_2) {
              operator_delete(local_768._M_dataplus._M_p,
                              CONCAT71(local_768.field_2._M_allocated_capacity._1_7_,
                                       local_768.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_748._M_dataplus._M_p != &local_748.field_2) {
              operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1
                             );
            }
            pbVar8 = pbVar8 + 1;
          } while (pbVar8 != local_6d8);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_788);
      uVar7 = local_7cc;
    }
    else {
      local_5d8._0_8_ = (size_type *)0x22;
      local_5d8._8_8_ = "Bad path to Mesa, could not find: ";
      local_5d8._16_8_ = local_6c8._M_string_length;
      local_5d8._24_8_ = local_6c8._M_dataplus._M_p;
      local_5b0 = &local_3c0;
      local_3d0 = (undefined1  [8])&DAT_00000001;
      local_3c0._M_local_buf[0] = ' ';
      local_5b8 = 1;
      views_03._M_len = 3;
      views_03._M_array = (iterator)local_5d8;
      local_3c8 = local_5b0;
      cmCatViews_abi_cxx11_((string *)local_6a8,views_03);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
        operator_delete((void *)local_6a8._0_8_,(ulong)(local_6a8._16_8_ + 1));
      }
      uVar7 = 0;
    }
    uVar6 = (undefined1)uVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_5d8._0_8_ = local_5d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5d8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_5d8._0_8_ != local_5d8 + 0x10) {
      operator_delete((void *)local_5d8._0_8_,local_5d8._16_8_ + 1);
    }
    uVar6 = 0;
  }
  return (bool)uVar6;
}

Assistant:

bool cmUseMangledMesaCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  // expected two arguments:
  // argument one: the full path to gl_mangle.h
  // argument two : directory for output of edited headers
  if (args.size() != 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  const std::string& inputDir = args[0];
  std::string glh = cmStrCat(inputDir, "/gl.h");
  if (!cmSystemTools::FileExists(glh)) {
    std::string e = cmStrCat("Bad path to Mesa, could not find: ", glh, ' ');
    status.SetError(e);
    return false;
  }
  const std::string& destDir = args[1];
  std::vector<std::string> files;
  cmSystemTools::Glob(inputDir, "\\.h$", files);
  if (files.empty()) {
    cmSystemTools::Error("Could not open Mesa Directory " + inputDir);
    return false;
  }
  cmSystemTools::MakeDirectory(destDir);
  for (std::string const& f : files) {
    std::string path = cmStrCat(inputDir, '/', f);
    CopyAndFullPathMesaHeader(path, destDir);
  }

  return true;
}